

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

int WI_drawLF(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = WI_DrawName(CleanYfac * 2,wbs->LName0,lnametexts[0].Chars);
  iVar2 = (finished.mFont)->FontHeight;
  iVar3 = ((mapname.mFont)->FontHeight - iVar2) * CleanYfac;
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar1 = iVar1 - (iVar4 >> 2);
  iVar4 = iVar2 * 3 + 3;
  if (-1 < iVar2 * 3) {
    iVar4 = iVar2 * 3;
  }
  if (iVar1 < (0x32 - (iVar4 >> 2)) * CleanYfac) {
    iVar2 = WI_DrawPatchText(iVar1,&finished,"WI_FINISHED");
    return iVar2;
  }
  return iVar1;
}

Assistant:

int WI_drawLF ()
{
	int y = WI_TITLEY * CleanYfac;

	y = WI_DrawName(y, wbs->LName0, lnametexts[0]);
	
	// Adjustment for different font sizes for map name and 'finished'.
	y -= ((mapname.mFont->GetHeight() - finished.mFont->GetHeight()) * CleanYfac) / 4;

	// draw "Finished!"
	if (y < (NG_STATSY - finished.mFont->GetHeight()*3/4) * CleanYfac)
	{
		// don't draw 'finished' if the level name is too tall
		y = WI_DrawPatchText(y, &finished, "WI_FINISHED");
	}
	return y;
}